

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch.hpp
# Opt level: O1

void __thiscall
notch::core::FullyConnectedLayer::calcLocalGrad(FullyConnectedLayer *this,Array *errors)

{
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  float *x_begin;
  float *z_begin;
  float *y_begin;
  float *y_end;
  float *z_end;
  float *x_end;
  
  sVar1 = (this->activationGrad)._M_size;
  sVar2 = errors->_M_size;
  if (sVar1 != sVar2) {
    __assert_fail("activationGrad.size() == errors.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/astanin[P]notch/notch.hpp"
                  ,0x5bb,"void notch::FullyConnectedLayer::calcLocalGrad(const Array &)");
  }
  sVar3 = (this->localGrad)._M_size;
  if (sVar3 != sVar2) {
    __assert_fail("localGrad.size() == errors.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/astanin[P]notch/notch.hpp"
                  ,0x5bc,"void notch::FullyConnectedLayer::calcLocalGrad(const Array &)");
  }
  x_begin = (this->activationGrad)._M_data;
  x_end = x_begin + sVar1;
  if (sVar1 == 0) {
    x_end = (float *)0x0;
    x_begin = (float *)0x0;
  }
  z_begin = (this->localGrad)._M_data;
  y_begin = errors->_M_data;
  y_end = y_begin + sVar2;
  if (sVar2 == 0) {
    y_end = (float *)0x0;
    y_begin = (float *)0x0;
  }
  z_end = z_begin + sVar3;
  if (sVar3 == 0) {
    z_end = (float *)0x0;
    z_begin = (float *)0x0;
  }
  internal::emul<float*,float_const*,float*>(x_begin,x_end,y_begin,y_end,z_begin,z_end);
  return;
}

Assistant:

void calcLocalGrad(const Array &errors) {
        assert(activationGrad.size() == errors.size());
        assert(localGrad.size() == errors.size());
#ifdef NOTCH_DISABLE_OPTIMIZATIONS
        localGrad = activationGrad * errors;
#else /* optimized version */
        internal::emul(std::begin(activationGrad), std::end(activationGrad),
                       std::begin(errors), std::end(errors),
                       std::begin(localGrad), std::end(localGrad));
#endif
    }